

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook_stdio.c
# Opt level: O2

_Bool fs_stdio_close_directory(ALLEGRO_FS_ENTRY *fp)

{
  int iVar1;
  int *piVar2;
  
  if (fp[0x15].vtable == (ALLEGRO_FS_INTERFACE *)0x0) {
    iVar1 = 0x14;
  }
  else {
    iVar1 = closedir((DIR *)fp[0x15].vtable);
    fp[0x15].vtable = (ALLEGRO_FS_INTERFACE *)0x0;
    if (iVar1 != -1) {
      return true;
    }
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  }
  al_set_errno(iVar1);
  return false;
}

Assistant:

static bool fs_stdio_close_directory(ALLEGRO_FS_ENTRY *fp)
{
   ALLEGRO_FS_ENTRY_STDIO *fp_stdio = (ALLEGRO_FS_ENTRY_STDIO *) fp;
   int rc;

   if (!fp_stdio->dir) {
      al_set_errno(ENOTDIR);
      return false;
   }

   rc = WRAP_CLOSEDIR(fp_stdio->dir);
   fp_stdio->dir = NULL;
   if (rc == -1) {
      al_set_errno(errno);
      return false;
   }

   return true;
}